

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O1

ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
* __thiscall
flow::IRProgram::
get<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::__cxx11::string>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
          *table,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *literal)

{
  __uniq_ptr_impl<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
  _Var1;
  long lVar2;
  int iVar3;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *extraout_RAX;
  undefined4 extraout_var;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *extraout_RAX_00;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *this_00;
  long lVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  _Head_base<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_false>
  local_58;
  string local_50;
  _Head_base<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_false>
  _Var4;
  
  _Var4._M_head_impl =
       (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
        *)(table->
          super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(table->
                super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)_Var4._M_head_impl;
  bVar7 = lVar5 == 0;
  if (!bVar7) {
    lVar6 = 0;
    do {
      _Var1._M_t.
      super__Tuple_impl<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
      .
      super__Head_base<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_false>
      ._M_head_impl =
           (table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
           super___uniq_ptr_impl<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
           ._M_t;
      lVar2 = *(long *)((long)_Var1._M_t.
                              super__Tuple_impl<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
                              .
                              super__Head_base<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_false>
                              ._M_head_impl + 0x48);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar2,
                 *(long *)((long)_Var1._M_t.
                                 super__Tuple_impl<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
                                 .
                                 super__Head_base<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_false>
                                 ._M_head_impl + 0x50) + lVar2);
      _Var4._M_head_impl = extraout_RAX;
      if (local_50._M_string_length == literal->_M_string_length) {
        if (local_50._M_string_length == 0) {
          bVar8 = true;
        }
        else {
          iVar3 = bcmp(local_50._M_dataplus._M_p,(literal->_M_dataplus)._M_p,
                       local_50._M_string_length);
          _Var4._M_head_impl =
               (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                *)CONCAT44(extraout_var,iVar3);
          bVar8 = iVar3 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
        _Var4._M_head_impl = extraout_RAX_00;
      }
      if (bVar8) {
        _Var4._M_head_impl =
             *(ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
               **)&(table->
                   super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
                   super___uniq_ptr_impl<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
                   ._M_t;
        break;
      }
      lVar6 = lVar6 + 1;
      bVar7 = lVar5 >> 3 == lVar6;
    } while (!bVar7);
  }
  if (bVar7) {
    this_00 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
               *)operator_new(0x68);
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
    ::ConstantValue(this_00,literal,&local_50);
    local_58._M_head_impl = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::default_delete<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>>,std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::default_delete<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>>>>
    ::
    emplace_back<std::unique_ptr<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::default_delete<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>>>
              ((vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::default_delete<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>>,std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::default_delete<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>>>>
                *)table,(unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
                         *)&local_58);
    if (local_58._M_head_impl !=
        (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
         *)0x0) {
      (*((local_58._M_head_impl)->super_Constant).super_Value._vptr_Value[1])();
    }
    _Var4._M_head_impl =
         (table->
         super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
         .
         super__Head_base<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_false>
         ._M_head_impl;
  }
  return _Var4._M_head_impl;
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}